

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipc.c
# Opt level: O1

void nn_cipc_shutdown(nn_fsm *self,int src,int type,void *srcptr)

{
  ulong extraout_RAX;
  
  if (type == -3 && src == -2) goto LAB_001a6ed6;
  while ((*(int *)&self[1].fn != 8 || (nn_cipc_shutdown_cold_2(), (extraout_RAX & 1) == 0))) {
    if (*(int *)&self[1].fn == 9) {
      nn_cipc_shutdown_cold_4();
      return;
    }
    nn_cipc_shutdown_cold_3();
LAB_001a6ed6:
    nn_cipc_shutdown_cold_1();
  }
  return;
}

Assistant:

static void nn_cipc_shutdown (struct nn_fsm *self, int src, int type,
    NN_UNUSED void *srcptr)
{
    struct nn_cipc *cipc;

    cipc = nn_cont (self, struct nn_cipc, fsm);

    if (nn_slow (src == NN_FSM_ACTION && type == NN_FSM_STOP)) {
        if (!nn_sipc_isidle (&cipc->sipc)) {
            nn_ep_stat_increment (cipc->ep, NN_STAT_DROPPED_CONNECTIONS, 1);
            nn_sipc_stop (&cipc->sipc);
        }
        cipc->state = NN_CIPC_STATE_STOPPING_SIPC_FINAL;
    }
    if (nn_slow (cipc->state == NN_CIPC_STATE_STOPPING_SIPC_FINAL)) {
        if (!nn_sipc_isidle (&cipc->sipc))
            return;
        nn_backoff_stop (&cipc->retry);
        nn_usock_stop (&cipc->usock);
        cipc->state = NN_CIPC_STATE_STOPPING;
    }
    if (nn_slow (cipc->state == NN_CIPC_STATE_STOPPING)) {
        if (!nn_backoff_isidle (&cipc->retry) ||
              !nn_usock_isidle (&cipc->usock))
            return;
        cipc->state = NN_CIPC_STATE_IDLE;
        nn_fsm_stopped_noevent (&cipc->fsm);
        nn_ep_stopped (cipc->ep);
        return;
    }

    nn_fsm_bad_state(cipc->state, src, type);
}